

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_topo(REF_CAVITY ref_cavity)

{
  REF_CELL pRVar1;
  REF_INT *pRVar2;
  uint uVar3;
  int iVar4;
  REF_LIST pRVar5;
  undefined8 uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  REF_INT nodes [27];
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  
  pRVar5 = ref_cavity->tet_list;
  if (0 < pRVar5->n) {
    pRVar1 = ref_cavity->ref_grid->cell[8];
    lVar8 = 0;
    do {
      uVar7 = pRVar5->value[lVar8];
      uVar3 = ref_cell_nodes(pRVar1,uVar7,(REF_INT *)&local_a8);
      if (uVar3 != 0) {
        uVar6 = 0x9d3;
        goto LAB_001a79a0;
      }
      printf("old tet %d %d %d %d (%d)\n",(ulong)local_a8,(ulong)local_a4,(ulong)local_a0,
             (ulong)local_9c,(ulong)uVar7);
      lVar8 = lVar8 + 1;
      pRVar5 = ref_cavity->tet_list;
    } while (lVar8 < pRVar5->n);
  }
  iVar4 = ref_cavity->maxface;
  if (0 < iVar4) {
    uVar7 = ref_cavity->node;
    lVar8 = 0;
    uVar10 = 0;
    do {
      pRVar2 = ref_cavity->f2n;
      if (((uVar7 != pRVar2[uVar10 * 3] && pRVar2[uVar10 * 3] != 0xffffffff) &&
          (uVar7 != pRVar2[uVar10 * 3 + 1])) && (uVar7 != pRVar2[uVar10 * 3 + 2])) {
        printf("new tet ");
        lVar9 = 0;
        do {
          printf(" %d ",(ulong)*(uint *)((long)ref_cavity->f2n + lVar9 * 4 + lVar8));
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        printf(" %d ",(ulong)uVar7);
        printf(" [%d]\n",uVar10 & 0xffffffff);
        iVar4 = ref_cavity->maxface;
      }
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0xc;
    } while ((long)uVar10 < (long)iVar4);
  }
  pRVar5 = ref_cavity->tri_list;
  if (0 < pRVar5->n) {
    pRVar1 = ref_cavity->ref_grid->cell[3];
    lVar8 = 0;
    do {
      uVar7 = pRVar5->value[lVar8];
      uVar3 = ref_cell_nodes(pRVar1,uVar7,(REF_INT *)&local_a8);
      if (uVar3 != 0) {
        uVar6 = 0x9e7;
LAB_001a79a0:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar6,"ref_cavity_topo",(ulong)uVar3,"cell");
        return uVar3;
      }
      printf("old tri %d %d %d faceid %d (%d)\n",(ulong)local_a8,(ulong)local_a4,(ulong)local_a0,
             (ulong)local_9c,(ulong)uVar7);
      lVar8 = lVar8 + 1;
      pRVar5 = ref_cavity->tri_list;
    } while (lVar8 < pRVar5->n);
  }
  uVar7 = ref_cavity->surf_node;
  if (uVar7 == 0xffffffff) {
    uVar7 = ref_cavity->node;
  }
  iVar4 = ref_cavity->maxseg;
  if (0 < iVar4) {
    lVar8 = 0;
    uVar10 = 0;
    do {
      uVar3 = *(uint *)((long)ref_cavity->s2n + lVar8);
      if ((uVar7 != uVar3 && uVar3 != 0xffffffff) &&
         (uVar7 != *(uint *)((long)ref_cavity->s2n + lVar8 + 4))) {
        printf("new tri ");
        printf(" %d ",(ulong)*(uint *)((long)ref_cavity->s2n + lVar8));
        printf(" %d ",(ulong)*(uint *)((long)ref_cavity->s2n + lVar8 + 4));
        printf(" %d ",(ulong)uVar7);
        printf(" faceid %d ",(ulong)*(uint *)((long)ref_cavity->s2n + lVar8 + 8));
        printf(" [%d]\n",uVar10 & 0xffffffff);
        iVar4 = ref_cavity->maxseg;
      }
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0xc;
    } while ((long)uVar10 < (long)iVar4);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_topo(REF_CAVITY ref_cavity) {
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT item, cell, face, face_node, seg;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    printf("old tet %d %d %d %d (%d)\n", nodes[0], nodes[1], nodes[2], nodes[3],
           cell);
  }

  node = ref_cavity_node(ref_cavity);
  each_ref_cavity_valid_face(ref_cavity, face) {
    if (node == ref_cavity_f2n(ref_cavity, 0, face)) continue;
    if (node == ref_cavity_f2n(ref_cavity, 1, face)) continue;
    if (node == ref_cavity_f2n(ref_cavity, 2, face)) continue;
    printf("new tet ");
    for (face_node = 0; face_node < 3; face_node++)
      printf(" %d ", ref_cavity_f2n(ref_cavity, face_node, face));
    printf(" %d ", node);
    printf(" [%d]\n", face);
  }

  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    printf("old tri %d %d %d faceid %d (%d)\n", nodes[0], nodes[1], nodes[2],
           nodes[3], cell);
  }

  node = ref_cavity_seg_node(ref_cavity);
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    if (node == ref_cavity_s2n(ref_cavity, 0, seg)) continue;
    if (node == ref_cavity_s2n(ref_cavity, 1, seg)) continue;
    printf("new tri ");
    printf(" %d ", ref_cavity_s2n(ref_cavity, 0, seg));
    printf(" %d ", ref_cavity_s2n(ref_cavity, 1, seg));
    printf(" %d ", node);
    printf(" faceid %d ", ref_cavity_s2n(ref_cavity, 2, seg));
    printf(" [%d]\n", seg);
  }

  return REF_SUCCESS;
}